

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slb_test.cc
# Opt level: O0

int test_set_load_balancer_ht_tp_listener_attribute(void)

{
  code *pcVar1;
  char *__s;
  SlbSetLoadBalancerHTTPListenerAttributeRequestType *pSVar2;
  HttpTestListener *pHVar3;
  allocator<char> local_3d1;
  int ret;
  HttpTestListener *local_3b0;
  HttpTestListener *listener;
  string local_3a0;
  allocator<char> local_379;
  string local_378 [39];
  allocator<char> local_351;
  string local_350 [55];
  allocator<char> local_319;
  string local_318 [32];
  SlbSetLoadBalancerHTTPListenerAttributeRequestType *local_2f8;
  Slb *slb;
  undefined1 local_2e8 [7];
  SlbSetLoadBalancerHTTPListenerAttributeResponseType resp;
  SlbSetLoadBalancerHTTPListenerAttributeRequestType req;
  
  aliyun::SlbSetLoadBalancerHTTPListenerAttributeRequestType::
  SlbSetLoadBalancerHTTPListenerAttributeRequestType
            ((SlbSetLoadBalancerHTTPListenerAttributeRequestType *)local_2e8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_318,"cn-hangzhou",&local_319);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_350,"my_appid",&local_351);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_378,"my_secret",&local_379);
  pSVar2 = (SlbSetLoadBalancerHTTPListenerAttributeRequestType *)
           aliyun::Slb::CreateSlbClient(local_318,local_350,local_378);
  std::__cxx11::string::~string(local_378);
  std::allocator<char>::~allocator(&local_379);
  std::__cxx11::string::~string(local_350);
  std::allocator<char>::~allocator(&local_351);
  std::__cxx11::string::~string(local_318);
  std::allocator<char>::~allocator(&local_319);
  local_2f8 = pSVar2;
  if (pSVar2 == (SlbSetLoadBalancerHTTPListenerAttributeRequestType *)0x0) {
    aliyun::SlbSetLoadBalancerHTTPListenerAttributeRequestType::
    ~SlbSetLoadBalancerHTTPListenerAttributeRequestType
              ((SlbSetLoadBalancerHTTPListenerAttributeRequestType *)local_2e8);
    return 0;
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_3a0,"127.0.0.1:12234",(allocator<char> *)((long)&listener + 7));
  aliyun::Slb::SetProxyHost((Slb *)pSVar2,&local_3a0);
  std::__cxx11::string::~string((string *)&local_3a0);
  std::allocator<char>::~allocator((allocator<char> *)((long)&listener + 7));
  aliyun::Slb::SetUseTls((Slb *)local_2f8,false);
  pHVar3 = (HttpTestListener *)operator_new(0x180);
  HttpTestListener::HttpTestListener(pHVar3,0x2fca);
  __s = test_set_load_balancer_ht_tp_listener_attribute_response;
  local_3b0 = pHVar3;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&ret,__s,&local_3d1);
  HttpTestListener::SetResponseBody(pHVar3,(string *)&ret);
  std::__cxx11::string::~string((string *)&ret);
  std::allocator<char>::~allocator(&local_3d1);
  HttpTestListener::Start(local_3b0);
  std::__cxx11::string::operator=((string *)local_2e8,"OwnerId");
  std::__cxx11::string::operator=
            ((string *)(req.owner_id.field_2._M_local_buf + 8),"ResourceOwnerAccount");
  std::__cxx11::string::operator=
            ((string *)(req.resource_owner_account.field_2._M_local_buf + 8),"ResourceOwnerId");
  std::__cxx11::string::operator=
            ((string *)(req.resource_owner_id.field_2._M_local_buf + 8),"LoadBalancerId");
  std::__cxx11::string::operator=
            ((string *)(req.load_balancer_id.field_2._M_local_buf + 8),"ListenerPort");
  std::__cxx11::string::operator=
            ((string *)(req.listener_port.field_2._M_local_buf + 8),"Bandwidth");
  std::__cxx11::string::operator=
            ((string *)(req.bandwidth.field_2._M_local_buf + 8),"XForwardedFor");
  std::__cxx11::string::operator=
            ((string *)(req.xforwarded_for.field_2._M_local_buf + 8),"Scheduler");
  std::__cxx11::string::operator=
            ((string *)(req.scheduler.field_2._M_local_buf + 8),"StickySession");
  std::__cxx11::string::operator=
            ((string *)(req.sticky_session.field_2._M_local_buf + 8),"StickySessionType");
  std::__cxx11::string::operator=
            ((string *)(req.sticky_session_type.field_2._M_local_buf + 8),"CookieTimeout");
  std::__cxx11::string::operator=((string *)(req.cookie_timeout.field_2._M_local_buf + 8),"Cookie");
  std::__cxx11::string::operator=((string *)(req.cookie.field_2._M_local_buf + 8),"HealthCheck");
  std::__cxx11::string::operator=
            ((string *)(req.health_check.field_2._M_local_buf + 8),"HealthCheckDomain");
  std::__cxx11::string::operator=
            ((string *)(req.health_check_domain.field_2._M_local_buf + 8),"HealthCheckURI");
  std::__cxx11::string::operator=
            ((string *)(req.health_check_ur_i.field_2._M_local_buf + 8),"HealthyThreshold");
  std::__cxx11::string::operator=
            ((string *)(req.healthy_threshold.field_2._M_local_buf + 8),"UnhealthyThreshold");
  std::__cxx11::string::operator=
            ((string *)(req.unhealthy_threshold.field_2._M_local_buf + 8),"HealthCheckTimeout");
  std::__cxx11::string::operator=
            ((string *)(req.health_check_timeout.field_2._M_local_buf + 8),"HealthCheckInterval");
  std::__cxx11::string::operator=
            ((string *)(req.health_check_interval.field_2._M_local_buf + 8),"HealthCheckConnectPort"
            );
  std::__cxx11::string::operator=
            ((string *)(req.health_check_connect_port.field_2._M_local_buf + 8),
             "HealthCheckHttpCode");
  std::__cxx11::string::operator=
            ((string *)(req.health_check_http_code.field_2._M_local_buf + 8),"MaxConnLimit");
  std::__cxx11::string::operator=
            ((string *)(req.max_conn_limit.field_2._M_local_buf + 8),"OwnerAccount");
  aliyun::Slb::SetLoadBalancerHTTPListenerAttribute
            (local_2f8,(SlbSetLoadBalancerHTTPListenerAttributeResponseType *)local_2e8,
             (SlbErrorInfo *)((long)&slb + 7));
  HttpTestListener::WaitComplete(local_3b0);
  pHVar3 = local_3b0;
  if (local_3b0 != (HttpTestListener *)0x0) {
    HttpTestListener::~HttpTestListener(local_3b0);
    operator_delete(pHVar3,0x180);
  }
  pSVar2 = local_2f8;
  if (local_2f8 != (SlbSetLoadBalancerHTTPListenerAttributeRequestType *)0x0) {
    aliyun::Slb::~Slb((Slb *)local_2f8);
    operator_delete(pSVar2,0x38);
  }
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

static int test_set_load_balancer_ht_tp_listener_attribute() {
  SlbSetLoadBalancerHTTPListenerAttributeRequestType req;
  SlbSetLoadBalancerHTTPListenerAttributeResponseType resp;
  Slb* slb = Slb::CreateSlbClient("cn-hangzhou", "my_appid", "my_secret");
  if(!slb) return 0;
  slb->SetProxyHost("127.0.0.1:12234");
  slb->SetUseTls(false);
  HttpTestListener* listener = new HttpTestListener(12234);
  listener->SetResponseBody(test_set_load_balancer_ht_tp_listener_attribute_response);
  listener->Start();
  req.owner_id = "OwnerId";
  req.resource_owner_account = "ResourceOwnerAccount";
  req.resource_owner_id = "ResourceOwnerId";
  req.load_balancer_id = "LoadBalancerId";
  req.listener_port = "ListenerPort";
  req.bandwidth = "Bandwidth";
  req.xforwarded_for = "XForwardedFor";
  req.scheduler = "Scheduler";
  req.sticky_session = "StickySession";
  req.sticky_session_type = "StickySessionType";
  req.cookie_timeout = "CookieTimeout";
  req.cookie = "Cookie";
  req.health_check = "HealthCheck";
  req.health_check_domain = "HealthCheckDomain";
  req.health_check_ur_i = "HealthCheckURI";
  req.healthy_threshold = "HealthyThreshold";
  req.unhealthy_threshold = "UnhealthyThreshold";
  req.health_check_timeout = "HealthCheckTimeout";
  req.health_check_interval = "HealthCheckInterval";
  req.health_check_connect_port = "HealthCheckConnectPort";
  req.health_check_http_code = "HealthCheckHttpCode";
  req.max_conn_limit = "MaxConnLimit";
  req.owner_account = "OwnerAccount";
  int ret = slb->SetLoadBalancerHTTPListenerAttribute(req, &resp, NULL);
  listener->WaitComplete();
  delete listener;
  delete slb;
}